

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcmStreamReader.cpp
# Opt level: O0

bool __thiscall LPCMStreamReader::detectLPCMType(LPCMStreamReader *this,uint8_t *buffer,int64_t len)

{
  bool bVar1;
  uint16_t uVar2;
  uint16_t frameLen;
  GUID *testWave64;
  uint8_t *curPos;
  uint8_t *end;
  int64_t len_local;
  uint8_t *buffer_local;
  LPCMStreamReader *this_local;
  
  if (len == 0) {
    this_local._7_1_ = false;
  }
  else if ((this->super_SimplePacketizerReader).m_containerDataType == 0x180) {
    this->m_headerType = htWAVE;
    this_local._7_1_ = true;
  }
  else if (((((*buffer == 'R') && (buffer[1] == 'I')) && (buffer[2] == 'F')) && (buffer[3] == 'F'))
          || (((*buffer == 'r' && (buffer[1] == 'i')) && ((buffer[2] == 'f' && (buffer[3] == 'f'))))
             )) {
    this->m_headerType = htWAVE;
    bVar1 = wave_format::GUID::operator==((GUID *)buffer,(GUID *)wave_format::WAVE64GUID);
    if (bVar1) {
      this->m_headerType = htWAVE64;
    }
    this_local._7_1_ = true;
  }
  else {
    testWave64 = (GUID *)buffer;
    if ((((this->m_testMode & 1U) == 0) ||
        ((this->super_SimplePacketizerReader).super_AbstractStreamReader.m_containerType == ctLPCM))
       || ((this->super_SimplePacketizerReader).m_containerDataType == 0x80)) {
      for (; testWave64 < (GUID *)(buffer + len);
          testWave64 = (GUID *)(testWave64->data4 + (long)(int)(uVar2 + 4) + -8)) {
        uVar2 = AV_RB16((uint8_t *)testWave64);
        if ((((((uVar2 != 0x3c0) && (uVar2 != 0x5a0)) && (uVar2 != 0x780)) &&
             (((uVar2 != 0xb40 && (uVar2 != 0xf00)) &&
              ((uVar2 != 0x10e0 && ((uVar2 != 0x1680 && (uVar2 != 0x1e00)))))))) &&
            (uVar2 != 0x21c0)) && ((uVar2 != 0x2d00 && (uVar2 != 0x4380)))) {
          return false;
        }
      }
      this->m_headerType = htM2TS;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool LPCMStreamReader::detectLPCMType(uint8_t* buffer, const int64_t len)
{
    if (len == 0)
        return false;

    if (m_containerDataType == TRACKTYPE_WAV)
    {
        m_headerType = LPCMHeaderType::htWAVE;
        return true;
    }

    const uint8_t* end = buffer + len;
    // 1. test for WAVEHeader
    uint8_t* curPos = buffer;
    if ((curPos[0] == 'R' && curPos[1] == 'I' && curPos[2] == 'F' && curPos[3] == 'F') ||
        (curPos[0] == 'r' && curPos[1] == 'i' && curPos[2] == 'f' && curPos[3] == 'f'))
    {
        m_headerType = LPCMHeaderType::htWAVE;
        const auto testWave64 = reinterpret_cast<GUID*>(curPos);
        if (*testWave64 == WAVE64GUID)
            m_headerType = LPCMHeaderType::htWAVE64;
        return true;
    }

    if (m_testMode && m_containerType != ContainerType::ctLPCM && m_containerDataType != TRACKTYPE_PCM)
        return false;  // LPCM definition has too few bytes. We can't detect LPCM without hints from source container

    // 2. test for M2TS LPCM headers
    curPos = buffer;
    while (curPos < end)
    {
        const uint16_t frameLen = AV_RB16(curPos);
        switch (frameLen)
        {
        case 960:
        case 1440:
        case 1920:
        case 2880:
        case 3840:
        case 4320:
        case 5760:
        case 7680:
        case 8640:
        case 11520:
        case 17280:
            curPos += frameLen + 4;
            break;
        default:
            return false;
        }
    }
    m_headerType = LPCMHeaderType::htM2TS;
    return true;
}